

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatCommon.h
# Opt level: O0

void __thiscall llvm::FmtAlign::format(FmtAlign *this,raw_ostream *S,StringRef Options)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  uint32_t Count;
  uint32_t Count_00;
  size_t X;
  size_t PadAmount;
  undefined1 local_b8 [8];
  raw_svector_ostream Stream;
  SmallString<64U> Item;
  raw_ostream *S_local;
  FmtAlign *this_local;
  StringRef Options_local;
  
  if (this->Amount == 0) {
    (**(code **)(*(long *)this->Adapter + 0x10))(this->Adapter,S,Options.Data,Options.Length);
  }
  else {
    SmallString<64U>::SmallString((SmallString<64U> *)&Stream.OS);
    raw_svector_ostream::raw_svector_ostream
              ((raw_svector_ostream *)local_b8,(SmallVectorImpl<char> *)&Stream.OS);
    (**(code **)(*(long *)this->Adapter + 0x10))(this->Adapter,local_b8,Options.Data,Options.Length)
    ;
    uVar3 = this->Amount;
    sVar1 = SmallVectorBase::size((SmallVectorBase *)&Stream.OS);
    if (sVar1 < uVar3) {
      sVar1 = this->Amount;
      sVar2 = SmallVectorBase::size((SmallVectorBase *)&Stream.OS);
      uVar3 = sVar1 - sVar2;
      Count = (uint32_t)uVar3;
      if (this->Where == Left) {
        raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
        fill(this,S,Count);
      }
      else if (this->Where == Center) {
        Count_00 = (uint32_t)(uVar3 >> 1);
        fill(this,S,Count_00);
        raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
        fill(this,S,Count - Count_00);
      }
      else {
        fill(this,S,Count);
        raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
      }
    }
    else {
      raw_ostream::operator<<(S,(SmallVectorImpl<char> *)&Stream.OS);
    }
    raw_svector_ostream::~raw_svector_ostream((raw_svector_ostream *)local_b8);
    SmallString<64U>::~SmallString((SmallString<64U> *)&Stream.OS);
  }
  return;
}

Assistant:

void format(raw_ostream &S, StringRef Options) {
    // If we don't need to align, we can format straight into the underlying
    // stream.  Otherwise we have to go through an intermediate stream first
    // in order to calculate how long the output is so we can align it.
    // TODO: Make the format method return the number of bytes written, that
    // way we can also skip the intermediate stream for left-aligned output.
    if (Amount == 0) {
      Adapter.format(S, Options);
      return;
    }
    SmallString<64> Item;
    raw_svector_ostream Stream(Item);

    Adapter.format(Stream, Options);
    if (Amount <= Item.size()) {
      S << Item;
      return;
    }

    size_t PadAmount = Amount - Item.size();
    switch (Where) {
    case AlignStyle::Left:
      S << Item;
      fill(S, PadAmount);
      break;
    case AlignStyle::Center: {
      size_t X = PadAmount / 2;
      fill(S, X);
      S << Item;
      fill(S, PadAmount - X);
      break;
    }
    default:
      fill(S, PadAmount);
      S << Item;
      break;
    }
  }